

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O2

store * store_at(chunk *c,loc grid)

{
  wchar_t wVar1;
  long lVar2;
  _Bool _Var3;
  wchar_t wVar4;
  store *psVar5;
  store *psVar6;
  long lVar7;
  
  _Var3 = square_isshop((chunk_conflict *)c,grid);
  psVar6 = (store *)0x0;
  if (_Var3) {
    psVar5 = (store *)(ulong)(uint)world->num_towns;
    if (world->num_towns < 1) {
      psVar5 = psVar6;
    }
    lVar2 = 0;
    do {
      lVar7 = lVar2;
      if ((long)psVar5 * 0x28 + 0x28 == lVar7 + 0x28) {
        return (store *)0x0;
      }
      lVar2 = lVar7 + 0x28;
    } while (*(int *)((long)&world->towns->index + lVar7) != world->levels[player->place].index);
    psVar6 = (store *)((long)&world->towns->stores + lVar7);
    do {
      psVar6 = psVar6->next;
      if (psVar6 == (store *)0x0) {
        return (store *)0x0;
      }
      wVar1 = psVar6->sidx;
      wVar4 = square_shopnum(cave,grid);
    } while (wVar1 != wVar4);
  }
  return psVar6;
}

Assistant:

struct store *store_at(struct chunk *c, struct loc grid)
{
	struct store *s = NULL;

	if (square_isshop(c, grid)) {
		struct level *lev = &world->levels[player->place];
		struct town *town = NULL;
		int i;
		for (i = 0; i < world->num_towns; i++) {
			town = &world->towns[i];
			if (town->index == lev->index) break;
		}
		if (i < world->num_towns) {
			for (s = town->stores; s; s = s->next) {
				if ((int) s->sidx == square_shopnum(cave, grid)) break;
			}
		}
	}

	return s;
}